

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_0::CWriter::WriteFuncDeclaration
          (CWriter *this,FuncDeclaration *decl,string *name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  char (*u) [2];
  char (*in_R8) [2];
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&(decl->sig).result_types;
  (anonymous_namespace)::CWriter::
  Write<wabt::(anonymous_namespace)::ResultType,char_const(&)[2],std::__cxx11::string_const&,char_const(&)[2]>
            ((CWriter *)this,(ResultType *)&local_38,(char (*) [2])name,in_RCX,in_R8);
  (anonymous_namespace)::CWriter::ModuleInstanceTypeName_abi_cxx11_(&local_38,(CWriter *)this);
  (anonymous_namespace)::CWriter::Write<std::__cxx11::string,char_const(&)[2]>
            ((CWriter *)this,&local_38,u);
  std::__cxx11::string::_M_dispose();
  WriteParamTypes(this,decl);
  WriteData(this,")",1);
  return;
}

Assistant:

void CWriter::WriteFuncDeclaration(const FuncDeclaration& decl,
                                   const std::string& name) {
  Write(ResultType(decl.sig.result_types), " ", name, "(");
  Write(ModuleInstanceTypeName(), "*");
  WriteParamTypes(decl);
  Write(")");
}